

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForMessage
          (Context *this,Descriptor *message)

{
  int iVar1;
  int iVar2;
  Descriptor *message_00;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>_>
  this_00;
  undefined1 in_R8B;
  string_view sVar3;
  string_view input;
  string_view input_00;
  string local_f0;
  string_view local_d0;
  string local_c0;
  undefined1 local_a0 [8];
  OneofGeneratorInfo info;
  OneofDescriptor *oneof;
  FieldDescriptor *pFStack_50;
  int i_2;
  int local_48;
  int i_1;
  undefined1 local_38 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int i;
  Descriptor *message_local;
  Context *this_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    iVar2 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    iVar1 = Descriptor::nested_type_count(message);
    if (iVar1 <= iVar2) break;
    message_00 = Descriptor::nested_type
                           (message,fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    InitializeFieldGeneratorInfoForMessage(this,message_00);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         fields.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_38);
  iVar2 = Descriptor::field_count(message);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_38,(long)iVar2);
  local_48 = 0;
  while( true ) {
    iVar2 = local_48;
    iVar1 = Descriptor::field_count(message);
    if (iVar1 <= iVar2) break;
    pFStack_50 = Descriptor::field(message,local_48);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_38,&stack0xffffffffffffffb0);
    local_48 = local_48 + 1;
  }
  InitializeFieldGeneratorInfoForFields
            (this,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_38);
  oneof._4_4_ = 0;
  while( true ) {
    iVar2 = Descriptor::oneof_decl_count(message);
    if (iVar2 <= oneof._4_4_) break;
    info.capitalized_name.field_2._8_8_ = Descriptor::oneof_decl(message,oneof._4_4_);
    OneofGeneratorInfo::OneofGeneratorInfo((OneofGeneratorInfo *)local_a0);
    sVar3 = OneofDescriptor::name((OneofDescriptor *)info.capitalized_name.field_2._8_8_);
    input._M_len = sVar3._M_str;
    input._M_str = (char *)0x0;
    local_d0 = sVar3;
    UnderscoresToCamelCase_abi_cxx11_(&local_c0,(java *)sVar3._M_len,input,(bool)in_R8B);
    std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    sVar3 = OneofDescriptor::name((OneofDescriptor *)info.capitalized_name.field_2._8_8_);
    input_00._M_len = sVar3._M_str;
    input_00._M_str = (char *)0x1;
    UnderscoresToCamelCase_abi_cxx11_(&local_f0,(java *)sVar3._M_len,input_00,(bool)in_R8B);
    std::__cxx11::string::operator=
              ((string *)(info.name.field_2._M_local_buf + 8),(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    this_00 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
              ::
              operator[]<google::protobuf::OneofDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
                          *)&this->oneof_generator_info_map_,
                         (key_arg<const_google::protobuf::OneofDescriptor_*> *)
                         ((long)&info.capitalized_name.field_2 + 8));
    OneofGeneratorInfo::operator=(this_00,(OneofGeneratorInfo *)local_a0);
    OneofGeneratorInfo::~OneofGeneratorInfo((OneofGeneratorInfo *)local_a0);
    oneof._4_4_ = oneof._4_4_ + 1;
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_38);
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForMessage(
    const Descriptor* message) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    InitializeFieldGeneratorInfoForMessage(message->nested_type(i));
  }
  std::vector<const FieldDescriptor*> fields;
  fields.reserve(message->field_count());
  for (int i = 0; i < message->field_count(); ++i) {
    fields.push_back(message->field(i));
  }
  InitializeFieldGeneratorInfoForFields(fields);

  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    OneofGeneratorInfo info;
    info.name = UnderscoresToCamelCase(oneof->name(), false);
    info.capitalized_name = UnderscoresToCamelCase(oneof->name(), true);
    oneof_generator_info_map_[oneof] = info;
  }
}